

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O2

void GPU_MatrixScale(float *result,float sx,float sy,float sz)

{
  float local_48 [6];
  undefined8 local_30;
  undefined8 uStack_28;
  float local_20;
  undefined8 local_1c;
  undefined8 uStack_14;
  undefined4 local_c;
  
  if (result != (float *)0x0) {
    local_48[1] = 0.0;
    local_48[2] = 0.0;
    local_48[3] = 0.0;
    local_48[4] = 0.0;
    local_30 = 0;
    uStack_28 = 0;
    local_1c = 0;
    uStack_14 = 0;
    local_c = 0x3f800000;
    local_48[0] = sx;
    local_48[5] = sy;
    local_20 = sz;
    GPU_MultiplyAndAssign(result,local_48);
  }
  return;
}

Assistant:

void GPU_MatrixScale(float* result, float sx, float sy, float sz)
{
    if(result == NULL)
		return;

	{
		float A[16];
		FILL_MATRIX_4x4(A,
				sx, 0, 0, 0,
				0, sy, 0, 0,
				0, 0, sz, 0,
				0, 0, 0, 1
			);

		GPU_MultiplyAndAssign(result, A);
	}
}